

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

bool __thiscall
HighsSymmetryDetection::mergeOrbits(HighsSymmetryDetection *this,HighsInt v1,HighsInt v2)

{
  int *piVar1;
  pointer piVar2;
  int iVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  bool bVar6;
  
  if (v1 == v2) {
    bVar6 = false;
  }
  else {
    HVar4 = getOrbit(this,v1);
    HVar5 = getOrbit(this,v2);
    bVar6 = HVar4 != HVar5;
    if (bVar6) {
      iVar3 = HVar5;
      if (HVar5 < HVar4) {
        iVar3 = HVar4;
      }
      if (HVar4 < HVar5) {
        HVar5 = HVar4;
      }
      (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] = HVar5;
      piVar2 = (this->orbitSize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = piVar2 + HVar5;
      *piVar1 = *piVar1 + piVar2[iVar3];
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool HighsSymmetryDetection::mergeOrbits(HighsInt v1, HighsInt v2) {
  if (v1 == v2) return false;

  HighsInt orbit1 = getOrbit(v1);
  HighsInt orbit2 = getOrbit(v2);

  if (orbit1 == orbit2) return false;

  if (orbit1 < orbit2) {
    orbitPartition[orbit2] = orbit1;
    orbitSize[orbit1] += orbitSize[orbit2];
  } else {
    orbitPartition[orbit1] = orbit2;
    orbitSize[orbit2] += orbitSize[orbit1];
  }

  return true;
}